

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

ParsedRfcDateTime rfcDateImpl(QStringView s)

{
  storage_type_conflict sVar1;
  storage_type_conflict *psVar2;
  anon_class_1_0_00000001 *this;
  uint uVar3;
  void *pvVar4;
  QDate QVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Category CVar9;
  qlonglong qVar10;
  qlonglong qVar11;
  qsizetype qVar12;
  qlonglong qVar13;
  char cVar14;
  storage_type_conflict *extraout_RDX;
  int iVar15;
  storage_type_conflict *psVar16;
  int base;
  undefined8 in_R8;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QStringView name;
  QStringView string_01;
  QStringView string_02;
  QStringView string_03;
  QStringView string_04;
  QStringView string_05;
  ParsedRfcDateTime PVar24;
  QStringView needle0;
  QStringView needle0_00;
  QStringView name_00;
  QStringView monthName;
  bool ok;
  iterator it;
  QVarLengthArray<QStringView,_6LL> words;
  QDate local_130;
  QDate local_128;
  char local_119;
  undefined1 local_118 [32];
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  QStringTokenizerBase<QStringView,_QChar> local_d8;
  QVLABase<QStringView> local_b8;
  QStringView QStack_a0;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  QDate *pQVar17;
  
  local_d8.m_haystack.m_data = s.m_data;
  local_d8.m_haystack.m_size = s.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QStack_a0.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_a0.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.super_QVLABaseBase.a = 6;
  local_b8.super_QVLABaseBase.s = 0;
  local_d8.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
  local_d8.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_d8.m_needle.ucs = L' ';
  local_d8._26_6_ = 0xaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_118._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_118._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_118._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.super_QVLABaseBase.ptr = &QStack_a0;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_118,&local_d8);
  iVar15 = 6;
  do {
    base = (int)in_R8;
    if (local_118[0x18] == false) break;
    QVLABase<QStringView>::emplace_back_impl<QStringView_const&>
              (&local_b8,6,&QStack_a0,(QStringView *)(local_118 + 8));
    QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_118);
    base = (int)in_R8;
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  pvVar4 = local_b8.super_QVLABaseBase.ptr;
  local_130.jd = -0x8000000000000000;
  uVar21 = 0xffffffff;
  if ((local_b8.super_QVLABaseBase.s < 3) || (local_118[0x18] != false)) {
    uVar18 = 0;
    goto LAB_0034e63b;
  }
  local_119 = '\x01';
  lVar22 = *(qsizetype *)local_b8.super_QVLABaseBase.ptr;
  psVar2 = *(storage_type_conflict **)((long)local_b8.super_QVLABaseBase.ptr + 8);
  if ((lVar22 == 0) || (psVar2[lVar22 + -1] != L',')) {
    sVar1 = *psVar2;
    bVar6 = true;
    if ((ushort)sVar1 - 0x30 < 10) {
      psVar16 = (storage_type_conflict *)0x0;
      lVar19 = 0;
    }
    else {
      if (0x7f < (ushort)sVar1) {
        CVar9 = QChar::category((uint)(ushort)sVar1);
        psVar16 = (storage_type_conflict *)0x0;
        lVar19 = 0;
        if (CVar9 == Number_DecimalDigit) goto LAB_0034e181;
      }
      QVLABase<QStringView>::erase
                (&local_b8,(const_iterator)pvVar4,(const_iterator)((long)pvVar4 + 0x10));
      bVar6 = false;
      psVar16 = psVar2;
      lVar19 = lVar22;
    }
  }
  else {
    QVLABase<QStringView>::erase
              (&local_b8,(const_iterator)local_b8.super_QVLABaseBase.ptr,
               (const_iterator)((long)local_b8.super_QVLABaseBase.ptr + 0x10));
    bVar6 = true;
    psVar16 = psVar2;
    lVar19 = lVar22 + -1;
  }
LAB_0034e181:
  iVar15 = 1;
  uVar21 = 0xffffffffaaaaaaaa;
  if (local_b8.super_QVLABaseBase.s - 6U < 0xfffffffffffffffd) {
LAB_0034e423:
    lVar22 = -0x8000000000000000;
  }
  else {
    uVar21 = 2;
    iVar7 = 0;
    if (bVar6) {
      iVar20 = 1;
      iVar8 = 0;
    }
    else if (local_b8.super_QVLABaseBase.s < 4) {
      iVar8 = 1;
      iVar20 = 0;
    }
    else {
      pQVar17 = &local_128;
      local_128.jd._0_2_ = 0x3a;
      iVar20 = 0;
      iVar8 = 1;
      needle0.m_data = (storage_type_conflict *)pQVar17;
      needle0.m_size = 1;
      qVar12 = QtPrivate::findString
                         (*(QStringView *)((long)local_b8.super_QVLABaseBase.ptr + 0x20),0,needle0,
                          CaseSensitive);
      base = (int)pQVar17;
      uVar21 = (ulong)(qVar12 == -1) ^ 3;
    }
    if (lVar19 != 0) {
      if ((((lVar19 == 3) &&
           ((sVar1 = *psVar16, (ushort)sVar1 - 0x41 < 0x1a ||
            ((0x7f < (ushort)sVar1 &&
             (CVar9 = QChar::category((uint)(ushort)sVar1), CVar9 == Letter_Uppercase)))))) &&
          ((sVar1 = psVar16[1], (ushort)sVar1 - 0x61 < 0x1a ||
           ((0x7f < (ushort)sVar1 &&
            (CVar9 = QChar::category((uint)(ushort)sVar1), CVar9 == Letter_Lowercase)))))) &&
         ((sVar1 = psVar16[2], (ushort)sVar1 - 0x61 < 0x1a ||
          ((0x7f < (ushort)sVar1 &&
           (CVar9 = QChar::category((uint)(ushort)sVar1), CVar9 == Letter_Lowercase)))))) {
        name_00.m_data = psVar16;
        name_00.m_size = 3;
        iVar7 = shortDayFromName(name_00);
        if (iVar7 != 0) goto LAB_0034e26f;
LAB_0034e41d:
        iVar15 = 5;
      }
      goto LAB_0034e423;
    }
LAB_0034e26f:
    string.m_data = (storage_type_conflict *)&local_119;
    string.m_size =
         *(qsizetype *)
          ((long)((long)local_b8.super_QVLABaseBase.ptr + 8) + (ulong)(uint)(iVar8 << 4));
    qVar10 = QString::toIntegral_helper
                       (*(QString **)
                         ((long)(qsizetype *)local_b8.super_QVLABaseBase.ptr +
                         (ulong)(uint)(iVar8 << 4)),string,(bool *)0xa,base);
    if ((int)qVar10 != qVar10) {
      local_119 = '\0';
      qVar10 = 0;
    }
    if (local_119 == '\0') {
LAB_0034e390:
      lVar22 = -0x8000000000000000;
      iVar15 = 1;
    }
    else {
      uVar18 = (ulong)(uint)((int)uVar21 << 4);
      string_00.m_data = (storage_type_conflict *)&local_119;
      string_00.m_size = *(qsizetype *)((long)((long)local_b8.super_QVLABaseBase.ptr + 8) + uVar18);
      qVar11 = QString::toIntegral_helper
                         (*(QString **)((long)(qsizetype *)local_b8.super_QVLABaseBase.ptr + uVar18)
                          ,string_00,(bool *)0xa,base);
      if ((int)qVar11 != qVar11) {
        local_119 = '\0';
        qVar11 = 0;
      }
      if (local_119 == '\0') goto LAB_0034e390;
      this = *(anon_class_1_0_00000001 **)
              ((long)(qsizetype *)local_b8.super_QVLABaseBase.ptr + (ulong)(uint)(iVar20 << 4));
      psVar2 = *(storage_type_conflict **)
                ((long)((long)local_b8.super_QVLABaseBase.ptr + 8) + (ulong)(uint)(iVar20 << 4));
      name.m_data = extraout_RDX;
      name.m_size = (qsizetype)psVar2;
      bVar6 = rfcDateImpl::anon_class_1_0_00000001::operator()(this,name);
      if (!bVar6) goto LAB_0034e390;
      monthName.m_data = psVar2;
      monthName.m_size = (qsizetype)this;
      iVar15 = fromShortMonthName(monthName);
      if (iVar15 < 0) goto LAB_0034e41d;
      QDate::QDate(&local_128,(int)qVar11,iVar15,(int)qVar10);
      lVar22 = CONCAT44(local_128.jd._4_4_,CONCAT22(local_128.jd._2_2_,(undefined2)local_128.jd));
      if (iVar7 == 0) {
        iVar15 = 0;
      }
      else {
        iVar15 = 0;
        iVar8 = 0;
        if (lVar22 + 0xb69eeff91fU < 0x16d3e147974) {
          iVar8 = QGregorianCalendar::weekDayOfJulian(lVar22);
        }
        if (iVar8 != iVar7) {
          lVar22 = -0x8000000000000000;
        }
      }
    }
  }
  if ((iVar15 != 5) && (iVar15 != 0)) goto LAB_0034e635;
  QVLABase<QStringView>::erase
            (&local_b8,(const_iterator)((long)local_b8.super_QVLABaseBase.ptr + uVar21 * 0x10),
             (const_iterator)((long)local_b8.super_QVLABaseBase.ptr + (uVar21 + 1) * 0x10));
  QVLABase<QStringView>::erase
            (&local_b8,(const_iterator)local_b8.super_QVLABaseBase.ptr,
             (const_iterator)((long)local_b8.super_QVLABaseBase.ptr + 0x20));
  pvVar4 = local_b8.super_QVLABaseBase.ptr;
  uVar23 = 0xffffffff;
  if (local_b8.super_QVLABaseBase.s == 0) {
LAB_0034e5e6:
    QVar5.jd = lVar22;
    if (local_b8.super_QVLABaseBase.s == 0) {
      uVar18 = 0;
    }
    else {
      lVar22 = *(qsizetype *)local_b8.super_QVLABaseBase.ptr;
      psVar2 = *(storage_type_conflict **)((long)local_b8.super_QVLABaseBase.ptr + 8);
      QVLABase<QStringView>::erase
                (&local_b8,(const_iterator)local_b8.super_QVLABaseBase.ptr,
                 (const_iterator)((long)local_b8.super_QVLABaseBase.ptr + 0x10));
      if (((local_b8.super_QVLABaseBase.s == 0) && ((lVar22 == 3 || (lVar22 == 5)))) &&
         ((sVar1 = *psVar2, sVar1 == L'-' || (sVar1 == L'+')))) {
        string_04.m_data = (storage_type_conflict *)&local_119;
        string_04.m_size = (qsizetype)(psVar2 + 1);
        qVar10 = QString::toIntegral_helper((QString *)0x2,string_04,(bool *)0xa,base);
        if ((int)qVar10 != qVar10) {
          local_119 = '\0';
          qVar10 = 0;
        }
        uVar18 = 0;
        iVar15 = 0;
        if (local_119 == '\0') {
          cVar14 = '\0';
        }
        else {
          if (lVar22 == 5) {
            string_05.m_size = psVar2 + 3;
            string_05.m_data = (storage_type_conflict *)&local_119;
            qVar11 = QString::toIntegral_helper((QString *)0x2,string_05,(bool *)0xa,base);
            if ((int)qVar11 != qVar11) {
              local_119 = '\0';
              qVar11 = 0;
            }
            iVar15 = (int)qVar11;
          }
          cVar14 = local_119;
          if (local_119 == '\0') goto LAB_0034e621;
          iVar15 = iVar15 + (int)qVar10 * 0x3c;
          uVar3 = iVar15 * -0x3c;
          if (sVar1 != L'-') {
            uVar3 = iVar15 * 0x3c;
          }
          uVar18 = (ulong)uVar3 << 0x20;
          cVar14 = '\x01';
        }
      }
      else {
        cVar14 = '\0';
LAB_0034e621:
        uVar18 = 0;
      }
      if (cVar14 == '\0') goto LAB_0034e635;
    }
  }
  else {
    pQVar17 = &local_128;
    local_128.jd._0_2_ = 0x3a;
    lVar19 = *(qsizetype *)local_b8.super_QVLABaseBase.ptr;
    psVar2 = *(storage_type_conflict **)((long)local_b8.super_QVLABaseBase.ptr + 8);
    needle0_00.m_data = (storage_type_conflict *)pQVar17;
    needle0_00.m_size = 1;
    qVar12 = QtPrivate::findString(*local_b8.super_QVLABaseBase.ptr,0,needle0_00,CaseSensitive);
    base = (int)pQVar17;
    if (qVar12 == -1) goto LAB_0034e5e6;
    QVLABase<QStringView>::erase
              (&local_b8,(const_iterator)pvVar4,(const_iterator)((long)pvVar4 + 0x10));
    uVar23 = 0xffffffff;
    if ((4 < lVar19) && (psVar2[2] == L':')) {
      if (lVar19 == 8) {
        bVar6 = psVar2[5] == L':';
      }
      else {
        bVar6 = lVar19 == 5;
      }
      if (!bVar6) goto LAB_0034e635;
      string_01.m_data = (storage_type_conflict *)&local_119;
      string_01.m_size = (qsizetype)psVar2;
      qVar10 = QString::toIntegral_helper((QString *)0x2,string_01,(bool *)0xa,base);
      if ((int)qVar10 != qVar10) {
        local_119 = '\0';
        qVar10 = 0;
      }
      if (local_119 == '\0') goto LAB_0034e635;
      string_02.m_data = (storage_type_conflict *)&local_119;
      string_02.m_size = (qsizetype)(psVar2 + 3);
      qVar11 = QString::toIntegral_helper((QString *)0x2,string_02,(bool *)0xa,base);
      if ((int)qVar11 != qVar11) {
        local_119 = '\0';
        qVar11 = 0;
      }
      uVar18 = 0;
      iVar15 = 0;
      QVar5.jd = local_130.jd;
      if (local_119 != '\0') {
        if (lVar19 == 8) {
          string_03.m_size = psVar2 + 6;
          string_03.m_data = (storage_type_conflict *)&local_119;
          qVar13 = QString::toIntegral_helper((QString *)0x2,string_03,(bool *)0xa,base);
          if ((int)qVar13 != qVar13) {
            local_119 = '\0';
            qVar13 = 0;
          }
          iVar15 = (int)qVar13;
        }
        if (local_119 != '\0') {
          base = 0;
          QTime::QTime((QTime *)&local_128,(int)qVar10,(int)qVar11,iVar15,0);
          uVar23 = CONCAT22(local_128.jd._2_2_,(undefined2)local_128.jd);
          goto LAB_0034e5e6;
        }
        goto LAB_0034e635;
      }
      goto LAB_0034e638;
    }
LAB_0034e635:
    uVar23 = 0xffffffff;
    uVar18 = 0;
    QVar5.jd = local_130.jd;
  }
LAB_0034e638:
  local_130.jd = QVar5.jd;
  uVar21 = (ulong)uVar23;
LAB_0034e63b:
  if ((QStringView *)local_b8.super_QVLABaseBase.ptr != &QStack_a0) {
    QtPrivate::sizedFree(local_b8.super_QVLABaseBase.ptr,local_b8.super_QVLABaseBase.a << 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  PVar24.time.mds = (int)(uVar18 | uVar21);
  PVar24.utcOffset = (int)((uVar18 | uVar21) >> 0x20);
  PVar24.date.jd = local_130.jd;
  return PVar24;
}

Assistant:

static ParsedRfcDateTime rfcDateImpl(QStringView s)
{
    // Matches "[ddd,] dd MMM yyyy[ hh:mm[:ss]] [±hhmm]" - correct RFC 822, 2822, 5322 format -
    // or           "ddd MMM dd[ hh:mm:ss] yyyy [±hhmm]" - permissive RFC 850, 1036 (read only)
    ParsedRfcDateTime result;

    QVarLengthArray<QStringView, 6> words;

    auto tokens = s.tokenize(u' ', Qt::SkipEmptyParts);
    auto it = tokens.begin();
    for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
        words.emplace_back(*it);

    if (words.size() < 3 || it != tokens.end())
        return result;
    const QChar colon(u':');
    bool ok = true;
    QDate date;

    const auto isShortName = [](QStringView name) {
        return (name.size() == 3 && name[0].isUpper()
                && name[1].isLower() && name[2].isLower());
    };

    /* Reject entirely (return) if the string is malformed; however, if the date
     * is merely invalid, (break, so as to) go on to parsing of the time.
     */
    int yearIndex;
    do { // "loop" so that we can use break on merely invalid, but "right shape" date.
        QStringView dayName;
        bool rfcX22 = true;
        const QStringView maybeDayName = words.front();
        if (maybeDayName.endsWith(u',')) {
            dayName = maybeDayName.chopped(1);
            words.erase(words.begin());
        } else if (!maybeDayName.front().isDigit()) {
            dayName = maybeDayName;
            words.erase(words.begin());
            rfcX22 = false;
        } // else: dayName is not specified (so we can only be RFC *22)
        if (words.size() < 3 || words.size() > 5)
            return result;

        // Don't break before setting yearIndex.
        int dayIndex, monthIndex;
        if (rfcX22) {
            // dd MMM yyyy [hh:mm[:ss]] [±hhmm]
            dayIndex = 0;
            monthIndex = 1;
            yearIndex = 2;
        } else {
            // MMM dd[ hh:mm:ss] yyyy [±hhmm]
            dayIndex = 1;
            monthIndex = 0;
            yearIndex = words.size() > 3 && words.at(2).contains(colon) ? 3 : 2;
        }

        int dayOfWeek = 0;
        if (!dayName.isEmpty()) {
            if (!isShortName(dayName))
                return result;
            dayOfWeek = shortDayFromName(dayName);
            if (!dayOfWeek)
                break;
        }

        const int day = words.at(dayIndex).toInt(&ok);
        if (!ok)
            return result;
        const int year = words.at(yearIndex).toInt(&ok);
        if (!ok)
            return result;
        const QStringView monthName = words.at(monthIndex);
        if (!isShortName(monthName))
            return result;
        int month = fromShortMonthName(monthName);
        if (month < 0)
            break;

        date = QDate(year, month, day);
        if (dayOfWeek && date.dayOfWeek() != dayOfWeek)
            date = QDate();
    } while (false);
    words.remove(yearIndex);
    words.remove(0, 2); // month and day-of-month, in some order

    // Time: [hh:mm[:ss]]
    QTime time;
    if (words.size() && words.at(0).contains(colon)) {
        const QStringView when = words.front();
        words.erase(words.begin());
        if (when.size() < 5 || when[2] != colon
            || (when.size() == 8 ? when[5] != colon : when.size() > 5)) {
            return result;
        }
        const int hour = when.first(2).toInt(&ok);
        if (!ok)
            return result;
        const int minute = when.sliced(3, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto secs = when.size() == 8 ? when.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        time = QTime(hour, minute, secs);
    }

    // Offset: [±hh[mm]]
    int offset = 0;
    if (words.size()) {
        const QStringView zone = words.front();
        words.erase(words.begin());
        if (words.size() || !(zone.size() == 3 || zone.size() == 5))
            return result;
        bool negate = false;
        if (zone[0] == u'-')
            negate = true;
        else if (zone[0] != u'+')
            return result;
        const int hour = zone.sliced(1, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto minute = zone.size() == 5 ? zone.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        offset = (hour * 60 + minute) * 60;
        if (negate)
            offset = -offset;
    }

    result.date = date;
    result.time = time;
    result.utcOffset = offset;
    return result;
}